

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O0

void decompressColor(int R_B,int G_B,int B_B,uint8 (*colors_RGB444) [3],uint8 (*colors) [3])

{
  char cVar1;
  char cVar2;
  char cVar3;
  uint8 (*colors_local) [3];
  uint8 (*colors_RGB444_local) [3];
  int B_B_local;
  int G_B_local;
  int R_B_local;
  
  cVar1 = (char)R_B;
  (*colors)[0] = (*colors_RGB444)[0] << (8U - cVar1 & 0x1f) |
                 (byte)((int)(uint)(*colors_RGB444)[0] >> (cVar1 * '\x02' - 8U & 0x1f));
  cVar2 = (char)G_B;
  (*colors)[1] = (*colors_RGB444)[1] << (8U - cVar2 & 0x1f) |
                 (byte)((int)(uint)(*colors_RGB444)[1] >> (cVar2 * '\x02' - 8U & 0x1f));
  cVar3 = (char)B_B;
  (*colors)[2] = (*colors_RGB444)[2] << (8U - cVar3 & 0x1f) |
                 (byte)((int)(uint)(*colors_RGB444)[2] >> (cVar3 * '\x02' - 8U & 0x1f));
  colors[1][0] = colors_RGB444[1][0] << (8U - cVar1 & 0x1f) |
                 (byte)((int)(uint)colors_RGB444[1][0] >> (cVar1 * '\x02' - 8U & 0x1f));
  colors[1][1] = colors_RGB444[1][1] << (8U - cVar2 & 0x1f) |
                 (byte)((int)(uint)colors_RGB444[1][1] >> (cVar2 * '\x02' - 8U & 0x1f));
  colors[1][2] = colors_RGB444[1][2] << (8U - cVar3 & 0x1f) |
                 (byte)((int)(uint)colors_RGB444[1][2] >> (cVar3 * '\x02' - 8U & 0x1f));
  return;
}

Assistant:

void decompressColor(int R_B, int G_B, int B_B, uint8 (colors_RGB444)[2][3], uint8 (colors)[2][3]) 
{
	// The color should be retrieved as:
	//
	// c = round(255/(r_bits^2-1))*comp_color
	//
	// This is similar to bit replication
	// 
	// Note -- this code only work for bit replication from 4 bits and up --- 3 bits needs
	// two copy operations.

 	colors[0][R] = (colors_RGB444[0][R] << (8 - R_B)) | (colors_RGB444[0][R] >> (R_B - (8-R_B)) );
 	colors[0][G] = (colors_RGB444[0][G] << (8 - G_B)) | (colors_RGB444[0][G] >> (G_B - (8-G_B)) );
 	colors[0][B] = (colors_RGB444[0][B] << (8 - B_B)) | (colors_RGB444[0][B] >> (B_B - (8-B_B)) );
 	colors[1][R] = (colors_RGB444[1][R] << (8 - R_B)) | (colors_RGB444[1][R] >> (R_B - (8-R_B)) );
 	colors[1][G] = (colors_RGB444[1][G] << (8 - G_B)) | (colors_RGB444[1][G] >> (G_B - (8-G_B)) );
 	colors[1][B] = (colors_RGB444[1][B] << (8 - B_B)) | (colors_RGB444[1][B] >> (B_B - (8-B_B)) );
}